

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int spng__inflate_stream
              (spng_ctx *ctx,char **out,size_t *len,size_t extra,void *start_buf,size_t start_len)

{
  uint uVar1;
  int iVar2;
  Bytef *pBVar3;
  Bytef *pBVar4;
  char *pcVar5;
  uInt uVar6;
  ulong uVar7;
  uint32_t bytes;
  ulong uVar8;
  ulong local_58;
  
  iVar2 = spng__inflate_init(ctx,0xf);
  if (iVar2 == 0) {
    uVar7 = ctx->chunk_cache_limit - ctx->chunk_cache_usage;
    if (ctx->max_chunk_size < uVar7) {
      uVar7 = ctx->max_chunk_size;
    }
    iVar2 = 0x4d;
    if (extra <= uVar7) {
      local_58 = 0x2000;
      pBVar3 = (Bytef *)(*(ctx->alloc).malloc_fn)(0x2000);
      if (pBVar3 == (Bytef *)0x0) {
        iVar2 = 2;
      }
      else {
        uVar6 = (uInt)start_len;
        if (start_len == 0) {
          uVar6 = 0;
        }
        if (start_len != 0) {
          start_len = (size_t)start_buf;
        }
        if (start_buf == (void *)0x0) {
          uVar6 = 0;
        }
        (ctx->zstream).avail_in = uVar6;
        (ctx->zstream).next_in = (Bytef *)start_len;
        (ctx->zstream).avail_out = 0x2000;
        (ctx->zstream).next_out = pBVar3;
        while( true ) {
          while( true ) {
            iVar2 = inflate(&ctx->zstream,0);
            if ((iVar2 != -5) && (iVar2 != 0)) {
              if ((iVar2 == 1) && (uVar7 = (ctx->zstream).total_out, uVar7 != 0)) {
                iVar2 = 2;
                uVar8 = uVar7 + extra;
                if ((!CARRY8(uVar7,extra)) &&
                   (pcVar5 = (char *)(*(ctx->alloc).realloc_fn)(pBVar3,uVar8), pcVar5 != (char *)0x0
                   )) {
                  if ((uVar8 != 0) &&
                     ((uVar7 = ctx->chunk_cache_usage + uVar8, !CARRY8(ctx->chunk_cache_usage,uVar8)
                      && (uVar7 <= ctx->chunk_cache_limit)))) {
                    ctx->chunk_cache_usage = uVar7;
                  }
                  *out = pcVar5;
                  *len = uVar8;
                  return 0;
                }
              }
              else {
                iVar2 = 0x40;
              }
              goto LAB_0010ae04;
            }
            if ((ctx->zstream).avail_out == 0) break;
            if ((ctx->zstream).avail_in == 0) {
              uVar1 = ctx->cur_chunk_bytes_left;
              bytes = 0x2000;
              if (uVar1 < 0x2000) {
                bytes = uVar1;
              }
              if ((*(ushort *)&ctx->field_0xcc & 1) == 0) {
                bytes = uVar1;
              }
              iVar2 = read_chunk_bytes(ctx,bytes);
              if (iVar2 != 0) {
                if (bytes == 0) {
                  iVar2 = 0x40;
                }
                goto LAB_0010ae04;
              }
              (ctx->zstream).avail_in = bytes;
              (ctx->zstream).next_in = ctx->data;
            }
          }
          if (uVar7 - extra >> 1 < local_58) {
            iVar2 = 0x4d;
            goto LAB_0010ae04;
          }
          pBVar4 = (Bytef *)(*(ctx->alloc).realloc_fn)(pBVar3,local_58 * 2);
          if (pBVar4 == (Bytef *)0x0) break;
          (ctx->zstream).avail_out = (uint)local_58 & 0x7fffffff;
          (ctx->zstream).next_out = pBVar4 + local_58;
          pBVar3 = pBVar4;
          local_58 = local_58 * 2;
        }
        iVar2 = 2;
LAB_0010ae04:
        (*(ctx->alloc).free_fn)(pBVar3);
      }
    }
  }
  return iVar2;
}

Assistant:

static int spng__inflate_stream(spng_ctx *ctx, char **out, size_t *len, size_t extra, const void *start_buf, size_t start_len)
{
    int ret = spng__inflate_init(ctx, 15);
    if(ret) return ret;

    size_t max = ctx->chunk_cache_limit - ctx->chunk_cache_usage;

    if(ctx->max_chunk_size < max) max = ctx->max_chunk_size;

    if(extra > max) return SPNG_ECHUNK_LIMITS;
    max -= extra;

    uint32_t read_size;
    size_t size = 8 * 1024;
    void *t, *buf = spng__malloc(ctx, size);

    if(buf == NULL) return SPNG_EMEM;

    z_stream *stream = &ctx->zstream;

    if(start_buf != NULL && start_len)
    {
        stream->avail_in = (uInt)start_len;
        stream->next_in = start_buf;
    }
    else
    {
        stream->avail_in = 0;
        stream->next_in = NULL;
    }

    stream->avail_out = (uInt)size;
    stream->next_out = buf;

    while(ret != Z_STREAM_END)
    {
        ret = inflate(stream, Z_NO_FLUSH);

        if(ret == Z_STREAM_END) break;

        if(ret != Z_OK && ret != Z_BUF_ERROR)
        {
            ret = SPNG_EZLIB;
            goto err;
        }

        if(!stream->avail_out) /* Resize buffer */
        {
            /* overflow or reached chunk/cache limit */
            if( (2 > SIZE_MAX / size) || (size > max / 2) )
            {
                ret = SPNG_ECHUNK_LIMITS;
                goto err;
            }

            size *= 2;

            t = spng__realloc(ctx, buf, size);
            if(t == NULL) goto mem;

            buf = t;

            stream->avail_out = (uInt)size / 2;
            stream->next_out = (unsigned char*)buf + size / 2;
        }
        else if(!stream->avail_in) /* Read more chunk bytes */
        {
            read_size = ctx->cur_chunk_bytes_left;
            if(ctx->streaming && read_size > SPNG_READ_SIZE) read_size = SPNG_READ_SIZE;

            ret = read_chunk_bytes(ctx, read_size);

            if(ret)
            {
                if(!read_size) ret = SPNG_EZLIB;

                goto err;
            }

            stream->avail_in = read_size;
            stream->next_in = ctx->data;
        }
    }

    size = stream->total_out;

    if(!size)
    {
        ret = SPNG_EZLIB;
        goto err;
    }

    size += extra;
    if(size < extra) goto mem;

    t = spng__realloc(ctx, buf, size);
    if(t == NULL) goto mem;

    buf = t;

    (void)increase_cache_usage(ctx, size, 0);

    *out = buf;
    *len = size;

    return 0;

mem:
    ret = SPNG_EMEM;
err:
    spng__free(ctx, buf);
    return ret;
}